

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<2UL> mserialize::cx_strcat<1ul,1ul>(cx_string<1UL> *strings,cx_string<1UL> *strings_1)

{
  char *pcVar1;
  size_t i;
  long lVar2;
  size_t s;
  ulong uVar3;
  char buffer [3];
  cx_string<2UL> local_4c;
  ulong auStack_48 [4];
  long lStack_28;
  cx_string<1UL> *local_20;
  cx_string<1UL> *local_18;
  
  pcVar1 = buffer;
  buffer[2] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  local_20 = strings;
  local_18 = strings_1;
  auStack_48[1] = 1;
  auStack_48[2] = 1;
  for (lVar2 = 1; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_48[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(char *)((&lStack_28)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<2UL>::cx_string(&local_4c,buffer);
  return (cx_string<2UL>)local_4c._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}